

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error.h
# Opt level: O1

void __thiscall nodecpp::error::system_error::system_error(system_error *this,errc code)

{
  error_value *peVar1;
  Valuetype local_70;
  
  error_value::error_value(&local_70.super_error_value);
  local_70.super_error_value._vptr_error_value = (_func_int **)&PTR__error_value_0012b390;
  local_70.errorCode = code;
  peVar1 = std_error_domain::create_value((std_error_domain *)&std_error_domain_obj,&local_70);
  (this->super_error).domain_ = (error_domain *)&std_error_domain_obj;
  (this->super_error).value_ = peVar1;
  local_70.super_error_value._vptr_error_value = (_func_int **)&PTR__error_value_0012a618;
  StackInfo::~StackInfo(&local_70.super_error_value.stackInfo);
  return;
}

Assistant:

system_error(errc code) : error( &std_error_domain_obj, std_error_domain_obj.create_value(code) ) {}